

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_buf.c
# Opt level: O0

size_t nghttp2_bufs_remove_copy(nghttp2_bufs *bufs,uint8_t *out)

{
  size_t len_00;
  undefined1 local_58 [8];
  nghttp2_buf resbuf;
  nghttp2_buf *buf;
  nghttp2_buf_chain *chain;
  size_t len;
  uint8_t *out_local;
  nghttp2_bufs *bufs_local;
  
  len_00 = nghttp2_bufs_len(bufs);
  nghttp2_buf_wrap_init((nghttp2_buf *)local_58,out,len_00);
  for (buf = (nghttp2_buf *)bufs->head; buf != (nghttp2_buf *)0x0; buf = (nghttp2_buf *)buf->begin)
  {
    resbuf.mark = (uint8_t *)&buf->end;
    resbuf.pos = nghttp2_cpymem(resbuf.pos,buf->last,(long)buf->mark - (long)buf->last);
  }
  return len_00;
}

Assistant:

size_t nghttp2_bufs_remove_copy(nghttp2_bufs *bufs, uint8_t *out) {
  size_t len;
  nghttp2_buf_chain *chain;
  nghttp2_buf *buf;
  nghttp2_buf resbuf;

  len = nghttp2_bufs_len(bufs);

  nghttp2_buf_wrap_init(&resbuf, out, len);

  for (chain = bufs->head; chain; chain = chain->next) {
    buf = &chain->buf;
    resbuf.last = nghttp2_cpymem(resbuf.last, buf->pos, nghttp2_buf_len(buf));
  }

  return len;
}